

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O2

vector3d * tinyusdz::vnormalize(vector3d *__return_storage_ptr__,vector3d *a,double eps)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined1 auVar3 [16];
  
  dVar2 = vlength(a);
  if (dVar2 <= eps) {
    dVar2 = eps;
  }
  auVar3._0_8_ = a->x;
  auVar3._8_8_ = a->y;
  auVar1._8_8_ = dVar2;
  auVar1._0_8_ = dVar2;
  auVar3 = divpd(auVar3,auVar1);
  __return_storage_ptr__->x = (double)auVar3._0_8_;
  __return_storage_ptr__->y = (double)auVar3._8_8_;
  __return_storage_ptr__->z = a->z / dVar2;
  return __return_storage_ptr__;
}

Assistant:

value::vector3d vnormalize(const value::vector3d &a, const double eps) {
  double len = vlength(a);
  len = (len > eps) ? len : eps;
  return value::vector3d({a[0] / len, a[1] / len, a[2] / len});
}